

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lundump.c
# Opt level: O0

LClosure * luaU_undump(lua_State *L,ZIO *Z,char *name,int fixed)

{
  StkId pSVar1;
  byte bVar2;
  LClosure *o;
  Proto *pPVar3;
  Table *x__1;
  TValue *io_1;
  LClosure *x_;
  TValue *io;
  LClosure *cl;
  LoadState S;
  int fixed_local;
  char *name_local;
  ZIO *Z_local;
  lua_State *L_local;
  
  if ((*name == '@') || (*name == '=')) {
    S.Z = (ZIO *)(name + 1);
  }
  else {
    S.Z = (ZIO *)name;
    if (*name == '\x1b') {
      S.Z = (ZIO *)anon_var_dwarf_1f82c;
    }
  }
  S.nstr._0_1_ = (undefined1)fixed;
  S.h = (Table *)0x1;
  cl = (LClosure *)L;
  S.L = (lua_State *)Z;
  S._52_4_ = fixed;
  checkHeader((LoadState *)&cl);
  bVar2 = loadByte((LoadState *)&cl);
  o = luaF_newLclosure(L,(uint)bVar2);
  pSVar1 = (L->top).p;
  *(LClosure **)pSVar1 = o;
  (pSVar1->val).tt_ = 'F';
  luaD_inctop(L);
  S.name = (char *)luaH_new(L);
  S.offset = 0;
  pSVar1 = (L->top).p;
  *(char **)pSVar1 = S.name;
  (pSVar1->val).tt_ = 'E';
  luaD_inctop(L);
  pPVar3 = luaF_newproto(L);
  o->p = pPVar3;
  if (((o->marked & 0x20) != 0) && ((o->p->marked & 0x18) != 0)) {
    luaC_barrier_(L,(GCObject *)o,(GCObject *)o->p);
  }
  loadFunction((LoadState *)&cl,o->p);
  if ((uint)o->nupvalues == o->p->sizeupvalues) {
    (L->top).p = (StkId)((L->top).offset + -0x10);
    return o;
  }
  error((LoadState *)&cl,"corrupted chunk");
}

Assistant:

LClosure *luaU_undump (lua_State *L, ZIO *Z, const char *name, int fixed) {
  LoadState S;
  LClosure *cl;
  if (*name == '@' || *name == '=')
    S.name = name + 1;
  else if (*name == LUA_SIGNATURE[0])
    S.name = "binary string";
  else
    S.name = name;
  S.L = L;
  S.Z = Z;
  S.fixed = cast_byte(fixed);
  S.offset = 1;  /* fist byte was already read */
  checkHeader(&S);
  cl = luaF_newLclosure(L, loadByte(&S));
  setclLvalue2s(L, L->top.p, cl);
  luaD_inctop(L);
  S.h = luaH_new(L);  /* create list of saved strings */
  S.nstr = 0;
  sethvalue2s(L, L->top.p, S.h);  /* anchor it */
  luaD_inctop(L);
  cl->p = luaF_newproto(L);
  luaC_objbarrier(L, cl, cl->p);
  loadFunction(&S, cl->p);
  if (cl->nupvalues != cl->p->sizeupvalues)
    error(&S, "corrupted chunk");
  luai_verifycode(L, cl->p);
  L->top.p--;  /* pop table */
  return cl;
}